

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O3

void heal_legs(void)

{
  char *oldstr;
  uint uVar1;
  char *line;
  
  if (u.uprops[0x20].intrinsic != 0 || u.uprops[0x20].extrinsic != 0) {
    if (u.atemp.a[3] < '\0') {
      u.atemp.a[3] = u.atemp.a[3] + '\x01';
      iflags.botl = '\x01';
    }
    if (u.usteed == (monst *)0x0) {
      uVar1 = ~u.uprops[0x20].extrinsic;
      oldstr = body_part(9);
      if ((uVar1 & 0x60000) == 0) {
        oldstr = makeplural(oldstr);
        line = "Your %s feel somewhat better.";
      }
      else {
        line = "Your %s feels somewhat better.";
      }
      pline(line,oldstr);
    }
    u.uprops[0x20].extrinsic = 0;
    u.uprops[0x20].intrinsic = 0;
  }
  encumber_msg();
  return;
}

Assistant:

void heal_legs(void)
{
	if (Wounded_legs) {
		if (ATEMP(A_DEX) < 0) {
			ATEMP(A_DEX)++;
			iflags.botl = 1;
		}

		if (!u.usteed)
		{
			/* KMH, intrinsics patch */
			if ((EWounded_legs & BOTH_SIDES) == BOTH_SIDES) {
			pline("Your %s feel somewhat better.",
				makeplural(body_part(LEG)));
		} else {
			pline("Your %s feels somewhat better.",
				body_part(LEG));
		}
		}
		HWounded_legs = EWounded_legs = 0;
	}
	encumber_msg();
}